

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# glTFExporter.cpp
# Opt level: O0

uint __thiscall Assimp::glTFExporter::ExportNodeHierarchy(glTFExporter *this,aiNode *n)

{
  bool bVar1;
  uint uVar2;
  element_type *peVar3;
  element_type *this_00;
  char *__s;
  Node *pNVar4;
  aiMatrix4x4 *v;
  Ref<glTF::Node> RVar5;
  Ref<glTF::Mesh> RVar6;
  value_type local_d0;
  uint local_c0;
  uint local_bc;
  uint idx;
  uint i_1;
  uint local_b0;
  value_type local_a8;
  uint local_94;
  vector<glTF::Node_*,_std::allocator<glTF::Node_*>_> *pvStack_90;
  uint i;
  uint local_88;
  allocator<char> local_69;
  string local_68;
  string local_48;
  undefined1 local_28 [8];
  Ref<glTF::Node> node;
  aiNode *n_local;
  glTFExporter *this_local;
  
  node._8_8_ = n;
  peVar3 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
           operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
                      &this->mAsset);
  this_00 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
            operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
                       )&this->mAsset);
  __s = aiString::C_Str((aiString *)node._8_8_);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_68,__s,&local_69);
  glTF::Asset::FindUniqueID(&local_48,this_00,&local_68,"node");
  RVar5 = glTF::LazyDict<glTF::Node>::Create(&peVar3->nodes,&local_48);
  pvStack_90 = RVar5.vector;
  local_88 = RVar5.index;
  local_28 = (undefined1  [8])pvStack_90;
  node.vector._0_4_ = local_88;
  std::__cxx11::string::~string((string *)&local_48);
  std::__cxx11::string::~string((string *)&local_68);
  std::allocator<char>::~allocator(&local_69);
  bVar1 = aiMatrix4x4t<float>::IsIdentity((aiMatrix4x4t<float> *)(node._8_8_ + 0x404));
  if (!bVar1) {
    pNVar4 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_28);
    (pNVar4->matrix).isPresent = true;
    v = (aiMatrix4x4 *)(node._8_8_ + 0x404);
    pNVar4 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_28);
    CopyValue(v,(pNVar4->matrix).value);
  }
  for (local_94 = 0; local_94 < *(uint *)(node._8_8_ + 0x460); local_94 = local_94 + 1) {
    pNVar4 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_28);
    peVar3 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar6 = glTF::LazyDict<glTF::Mesh>::Get
                      (&peVar3->meshes,
                       *(uint *)(*(long *)(node._8_8_ + 0x468) + (ulong)local_94 * 4));
    _idx = RVar6.vector;
    local_b0 = RVar6.index;
    local_a8.vector = _idx;
    local_a8.index = local_b0;
    std::vector<glTF::Ref<glTF::Mesh>,_std::allocator<glTF::Ref<glTF::Mesh>_>_>::push_back
              (&pNVar4->meshes,&local_a8);
  }
  for (local_bc = 0; local_bc < *(uint *)(node._8_8_ + 0x450); local_bc = local_bc + 1) {
    local_c0 = ExportNode(this,*(aiNode **)(*(long *)(node._8_8_ + 0x458) + (ulong)local_bc * 8),
                          (Ref<glTF::Node> *)local_28);
    pNVar4 = glTF::Ref<glTF::Node>::operator->((Ref<glTF::Node> *)local_28);
    peVar3 = std::__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<glTF::Asset,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)&this->mAsset);
    RVar5 = glTF::LazyDict<glTF::Node>::Get(&peVar3->nodes,local_c0);
    local_d0.vector = RVar5.vector;
    local_d0.index = RVar5.index;
    std::vector<glTF::Ref<glTF::Node>,_std::allocator<glTF::Ref<glTF::Node>_>_>::push_back
              (&pNVar4->children,&local_d0);
  }
  uVar2 = glTF::Ref<glTF::Node>::GetIndex((Ref<glTF::Node> *)local_28);
  return uVar2;
}

Assistant:

unsigned int glTFExporter::ExportNodeHierarchy(const aiNode* n)
{
    Ref<Node> node = mAsset->nodes.Create(mAsset->FindUniqueID(n->mName.C_Str(), "node"));

    if (!n->mTransformation.IsIdentity()) {
        node->matrix.isPresent = true;
        CopyValue(n->mTransformation, node->matrix.value);
    }

    for (unsigned int i = 0; i < n->mNumMeshes; ++i) {
        node->meshes.push_back(mAsset->meshes.Get(n->mMeshes[i]));
    }

    for (unsigned int i = 0; i < n->mNumChildren; ++i) {
        unsigned int idx = ExportNode(n->mChildren[i], node);
        node->children.push_back(mAsset->nodes.Get(idx));
    }

    return node.GetIndex();
}